

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Parser.h
# Opt level: O0

bool __thiscall
soul::heart::Parser::parseWriteStream
          (Parser *this,FunctionParseState *state,FunctionBuilder *builder)

{
  bool bVar1;
  Module *pMVar2;
  Expression *o;
  OutputDeclaration *output;
  Identifier *args;
  string_view sVar3;
  pool_ptr<soul::heart::Expression> local_f0;
  CodeLocation local_e8;
  Expression *local_d8;
  Expression *value;
  Type local_c8;
  pool_ptr<soul::heart::Expression> local_b0;
  char *local_a8;
  CompileMessage local_a0;
  pool_ptr<soul::heart::Expression> local_68;
  pool_ptr<soul::heart::Expression> index;
  undefined1 local_50 [8];
  pool_ptr<soul::heart::OutputDeclaration> target;
  Identifier local_38;
  Identifier name;
  CodeLocation writeStreamLocation;
  FunctionBuilder *builder_local;
  FunctionParseState *state_local;
  Parser *this_local;
  
  CodeLocation::CodeLocation
            ((CodeLocation *)&name,
             &(this->
              super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
              ).location);
  local_38 = parseGeneralIdentifier(this);
  pMVar2 = pool_ptr<soul::Module>::operator->(&this->module);
  sVar3 = Identifier::operator_cast_to_basic_string_view(&local_38);
  index.object = (Expression *)sVar3._M_len;
  sVar3._M_str = (char *)index.object;
  sVar3._M_len = (size_t)pMVar2;
  Module::findOutput((Module *)local_50,sVar3);
  pool_ptr<soul::heart::Expression>::pool_ptr(&local_68);
  bVar1 = pool_ptr<soul::heart::OutputDeclaration>::operator==
                    ((pool_ptr<soul::heart::OutputDeclaration> *)local_50,(void *)0x0);
  if (bVar1) {
    Errors::cannotFindOutput<soul::Identifier&>(&local_a0,(Errors *)&local_38,args);
    (*(this->
      super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
      )._vptr_Tokeniser[2])(this,&local_a0);
    CompileMessage::~CompileMessage(&local_a0);
  }
  local_a8 = "[";
  bVar1 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
          ::matchIf<soul::TokenType>
                    (&this->
                      super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                     ,(TokenType)0x575e01);
  if (bVar1) {
    Type::Type(&local_c8,int32);
    o = parseExpression(this,state,&local_c8);
    pool_ptr<soul::heart::Expression>::pool_ptr<soul::heart::Expression,void>(&local_b0,o);
    local_68.object = local_b0.object;
    pool_ptr<soul::heart::Expression>::~pool_ptr(&local_b0);
    Type::~Type(&local_c8);
    value = (Expression *)0x54ace4;
    Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
    expect<soul::TokenType>
              (&this->
                super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
               ,(TokenType)0x54ace4);
  }
  local_d8 = parseExpression(this,state);
  CodeLocation::CodeLocation(&local_e8,(CodeLocation *)&name);
  output = pool_ptr<soul::heart::OutputDeclaration>::operator*
                     ((pool_ptr<soul::heart::OutputDeclaration> *)local_50);
  local_f0.object = local_68.object;
  BlockBuilder::addWriteStream(&builder->super_BlockBuilder,&local_e8,output,&local_f0,local_d8);
  pool_ptr<soul::heart::Expression>::~pool_ptr(&local_f0);
  CodeLocation::~CodeLocation(&local_e8);
  expectSemicolon(this);
  pool_ptr<soul::heart::Expression>::~pool_ptr(&local_68);
  pool_ptr<soul::heart::OutputDeclaration>::~pool_ptr
            ((pool_ptr<soul::heart::OutputDeclaration> *)local_50);
  CodeLocation::~CodeLocation((CodeLocation *)&name);
  return true;
}

Assistant:

bool parseWriteStream (FunctionParseState& state, FunctionBuilder& builder)
    {
        auto writeStreamLocation = location;
        auto name = parseGeneralIdentifier();
        auto target = module->findOutput (name);

        pool_ptr<heart::Expression> index;

        if (target == nullptr)
            throwError (Errors::cannotFindOutput (name));

        if (matchIf (HEARTOperator::openBracket))
        {
            index = parseExpression (state, PrimitiveType::int32);
            expect (HEARTOperator::closeBracket);
        }

        auto& value = parseExpression (state);

        builder.addWriteStream (writeStreamLocation, *target, index, value);
        expectSemicolon();
        return true;
    }